

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O3

Status __thiscall
leveldb::BuildTable(leveldb *this,string *dbname,Env *env,Options *options,TableCache *table_cache,
                   Iterator *iter,FileMetaData *meta)

{
  int iVar1;
  TableBuilder *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint64_t uVar2;
  Iterator *pIVar3;
  Snapshot *extraout_RDX;
  leveldb *plVar4;
  char *__tmp;
  Rep *pRVar5;
  Rep *pRVar6;
  WritableFile *file;
  Slice key;
  string fname;
  WritableFile *local_98;
  void *local_90;
  Snapshot *pSStack_88;
  leveldb *local_80;
  Env *local_78;
  TableCache *local_70;
  Slice local_68;
  string local_58;
  void *local_38;
  
  pRVar5 = (Rep *)0x0;
  *(undefined8 *)this = 0;
  meta->file_size = 0;
  local_80 = this;
  local_70 = table_cache;
  (*iter->_vptr_Iterator[3])(iter);
  TableFileName(&local_58,dbname,meta->number);
  iVar1 = (*iter->_vptr_Iterator[2])(iter);
  if ((char)iVar1 != '\0') {
    (*env->_vptr_Env[4])(&local_90,env,&local_58,&local_98);
    *(void **)local_80 = local_90;
    plVar4 = local_80;
    if ((Rep *)local_90 != (Rep *)0x0) goto LAB_001238ac;
    local_78 = env;
    this_00 = (TableBuilder *)operator_new(8);
    TableBuilder::TableBuilder(this_00,options,local_98);
    iVar1 = (*iter->_vptr_Iterator[8])(iter);
    std::__cxx11::string::_M_replace
              ((ulong)&meta->smallest,0,(char *)(meta->smallest).rep_._M_string_length,
               CONCAT44(extraout_var,iVar1));
    iVar1 = (*iter->_vptr_Iterator[2])(iter);
    if ((char)iVar1 != '\0') {
      do {
        iVar1 = (*iter->_vptr_Iterator[8])(iter);
        local_90 = (void *)CONCAT44(extraout_var_00,iVar1);
        pSStack_88 = extraout_RDX;
        std::__cxx11::string::_M_replace
                  ((ulong)&meta->largest,0,(char *)(meta->largest).rep_._M_string_length,
                   (ulong)local_90);
        iVar1 = (*iter->_vptr_Iterator[9])(iter);
        local_68.data_ = (char *)CONCAT44(extraout_var_01,iVar1);
        TableBuilder::Add(this_00,(Slice *)&local_90,&local_68);
        (*iter->_vptr_Iterator[6])(iter);
        iVar1 = (*iter->_vptr_Iterator[2])(iter);
      } while ((char)iVar1 != '\0');
    }
    TableBuilder::Finish((TableBuilder *)&local_90);
    plVar4 = local_80;
    pRVar5 = (Rep *)local_90;
    pRVar6 = *(Rep **)local_80;
    *(void **)local_80 = local_90;
    local_90 = pRVar6;
    if (pRVar6 != (Rep *)0x0) {
      operator_delete__(pRVar6);
    }
    if (pRVar5 == (Rep *)0x0) {
      uVar2 = TableBuilder::FileSize(this_00);
      meta->file_size = uVar2;
      if (uVar2 == 0) {
        __assert_fail("meta->file_size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/builder.cc"
                      ,0x2b,
                      "Status leveldb::BuildTable(const std::string &, Env *, const Options &, TableCache *, Iterator *, FileMetaData *)"
                     );
      }
      TableBuilder::~TableBuilder(this_00);
      operator_delete(this_00);
      (*local_98->_vptr_WritableFile[5])(&local_90);
      *(void **)plVar4 = local_90;
      pRVar5 = (Rep *)local_90;
      if ((Rep *)local_90 == (Rep *)0x0) {
        (*local_98->_vptr_WritableFile[3])(&local_90);
        *(void **)plVar4 = local_90;
        pRVar5 = (Rep *)local_90;
      }
    }
    else {
      TableBuilder::~TableBuilder(this_00);
      operator_delete(this_00);
    }
    env = local_78;
    if (local_98 != (WritableFile *)0x0) {
      (*local_98->_vptr_WritableFile[1])();
    }
    local_98 = (WritableFile *)0x0;
    if (pRVar5 == (Rep *)0x0) {
      pSStack_88 = (Snapshot *)0x0;
      local_90 = (Rep *)0x100;
      pIVar3 = TableCache::NewIterator
                         (local_70,(ReadOptions *)&local_90,meta->number,meta->file_size,
                          (Table **)0x0);
      (*pIVar3->_vptr_Iterator[10])(&local_90,pIVar3);
      pRVar5 = (Rep *)local_90;
      *(void **)plVar4 = local_90;
      (*pIVar3->_vptr_Iterator[1])(pIVar3);
    }
  }
  (*iter->_vptr_Iterator[10])(&local_90,iter);
  plVar4 = local_80;
  pRVar6 = pRVar5;
  if ((Rep *)local_90 != (Rep *)0x0) {
    operator_delete__(local_90);
    (*iter->_vptr_Iterator[10])(&local_90,iter);
    plVar4 = local_80;
    *(void **)local_80 = local_90;
    pRVar6 = (Rep *)local_90;
    local_90 = pRVar5;
    if (pRVar5 != (Rep *)0x0) {
      operator_delete__(pRVar5);
      pRVar6 = *(Rep **)plVar4;
    }
  }
  if (((pRVar6 != (Rep *)0x0) || (meta->file_size == 0)) &&
     ((*env->_vptr_Env[8])(&local_38,env,&local_58), local_38 != (void *)0x0)) {
    operator_delete__(local_38);
  }
LAB_001238ac:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return (Status)(char *)plVar4;
}

Assistant:

Status BuildTable(const std::string& dbname, Env* env, const Options& options,
                  TableCache* table_cache, Iterator* iter, FileMetaData* meta) {
  Status s;
  meta->file_size = 0;
  iter->SeekToFirst();

  std::string fname = TableFileName(dbname, meta->number);
  if (iter->Valid()) {
    WritableFile* file;
    s = env->NewWritableFile(fname, &file);
    if (!s.ok()) {
      return s;
    }

    TableBuilder* builder = new TableBuilder(options, file);
    meta->smallest.DecodeFrom(iter->key());
    for (; iter->Valid(); iter->Next()) {
      Slice key = iter->key();
      meta->largest.DecodeFrom(key);
      builder->Add(key, iter->value());
    }

    // Finish and check for builder errors
    s = builder->Finish();
    if (s.ok()) {
      meta->file_size = builder->FileSize();
      assert(meta->file_size > 0);
    }
    delete builder;

    // Finish and check for file errors
    if (s.ok()) {
      s = file->Sync();
    }
    if (s.ok()) {
      s = file->Close();
    }
    delete file;
    file = nullptr;

    if (s.ok()) {
      // Verify that the table is usable
      Iterator* it = table_cache->NewIterator(ReadOptions(), meta->number,
                                              meta->file_size);
      s = it->status();
      delete it;
    }
  }

  // Check for input iterator errors
  if (!iter->status().ok()) {
    s = iter->status();
  }

  if (s.ok() && meta->file_size > 0) {
    // Keep it
  } else {
    env->RemoveFile(fname);
  }
  return s;
}